

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg.c
# Opt level: O1

keypress borg_inkey_hack(wchar_t flush_first)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  keycode_t kVar4;
  errr eVar5;
  int iVar6;
  wchar_t wVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 extraout_RDX;
  keypress kVar10;
  uint8_t t_a;
  keypress key;
  wchar_t x;
  wchar_t y;
  ui_event ch_evt;
  char buffer [1024];
  uint8_t local_459;
  keypress local_458;
  wchar_t local_44c;
  wchar_t local_448;
  ui_event local_444;
  keypress local_438;
  char acStack_429 [1025];
  
  local_458.mods = '\0';
  local_458._9_3_ = 0;
  local_458.type = EVT_KBRD;
  local_458.code = 0;
  local_448 = L'\0';
  local_44c = (Term->wid + -1) / (int)(uint)tile_width;
  Term_locate(&local_44c,&local_448);
  Term_fresh();
  if (borg_active == false) {
    borg_note("# Removing keypress hook");
    inkey_hack = (_func_keypress_int *)0x0;
    borg_flush();
    flush(EVENT_MAP,(game_event_data *)0x0,(void *)0x0);
    if ((uint)key_mode < 2) {
      option_set("rogue_like_commands",key_mode);
    }
    local_458.type = EVT_KBRD;
    local_458.code = 0xe000;
    goto LAB_0025876a;
  }
  if (flush_first != L'\0') {
    kVar4 = borg_inkey(false);
    if (kVar4 != 0) {
      borg_note("# Flushing keypress buffer");
      borg_flush();
      if (0xfa < borg.time_this_panel) {
        borg_respawning = 3;
      }
    }
  }
  bVar1 = false;
  borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&local_459,acStack_429 + 1);
  pcVar8 = borg_trim(acStack_429 + 1);
  if (local_459 != '\0') {
    if ((((*pcVar8 == ' ') && (pcVar8[1] == ' ')) && (pcVar8[2] == ' ')) && (pcVar8[3] == ' ')) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  bVar2 = bVar1;
  if (bVar1) {
    _Var3 = prefix(pcVar8,"Type");
    bVar2 = false;
    if (!_Var3) {
      bVar2 = bVar1;
    }
  }
  if (((bVar2) && (inkey_flag == false)) && (*pcVar8 != '\0')) {
    _Var3 = borg_react_prompted(pcVar8,&local_458,local_44c,local_448);
    if (_Var3) goto LAB_0025876a;
  }
  if (player->is_dead != true) {
    if ((bVar2) && (((L'\x06' < local_44c && local_448 == L'\0') & ~inkey_flag) == 1)) {
      eVar5 = borg_what_text(local_44c + L'\xfffffff9',L'\0',L'\a',&local_459,acStack_429 + 1);
      if (eVar5 != 0) goto LAB_00258565;
      _Var3 = suffix(acStack_429 + 1," -more-");
      if (!_Var3) goto LAB_00258565;
      if (*borg_cfg != 0) {
        borg_note("# message with -more-");
      }
      eVar5 = borg_what_text(L'\0',L'\0',local_44c + L'\xfffffff9',&local_459,acStack_429 + 1);
      if (eVar5 == 0) {
        borg_parse(acStack_429 + 1);
      }
      if (*borg_cfg != 0) {
        borg_note("clearing -more-");
      }
LAB_00258603:
      local_458.code = 0x20;
      goto LAB_0025876a;
    }
LAB_00258565:
    if (character_dungeon == false) {
      if (*borg_cfg != 0) {
        borg_note("# Mid reincarnation, no map yet");
      }
      local_458.code = 0x9c;
      borg_respawning = borg_respawning + -1;
      if (borg_respawning < 1) {
        borg_oops("reincarnation failure");
      }
      goto LAB_0025876a;
    }
    if ((bVar2) && (inkey_flag == true)) {
      if (*borg_cfg != 0) {
        borg_note("# parse normal message");
      }
      eVar5 = borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&local_459,
                             acStack_429 + 1);
      if (eVar5 == 0) {
        uVar9 = strlen(acStack_429 + 1);
        iVar6 = (int)uVar9;
        if (0 < iVar6) {
          do {
            iVar6 = (int)uVar9;
            if (acStack_429[uVar9 & 0xffffffff] != ' ') goto LAB_002585f2;
            uVar9 = (ulong)(iVar6 - 1);
          } while (1 < iVar6);
          iVar6 = 0;
        }
LAB_002585f2:
        acStack_429[(long)iVar6 + 1] = '\0';
        borg_parse(acStack_429 + 1);
      }
      goto LAB_00258603;
    }
    borg_parse((char *)0x0);
    borg_dont_react = false;
    kVar4 = borg_inkey(true);
    if (kVar4 != 0) {
LAB_00258679:
      local_458.code = kVar4;
      goto LAB_0025876a;
    }
    Term_inkey(&local_444,false,true);
    if (0 < borg.trait[0x69]) {
      borg.in_shop = false;
    }
    if ((borg.in_shop == false) && ((local_444.type & EVT_KBRD) != EVT_NONE)) {
      if ((local_444.key.code == 0) || (local_444.key.code == 10)) goto LAB_002586b1;
      if (local_444.key.code - 0x20 < 0x5f) {
        pcVar8 = format("# User key press <%lu><%c>",(ulong)local_444.key.code,
                        (ulong)local_444.key.code);
      }
      else {
        pcVar8 = format("# User key press <%lu>");
      }
      borg_note(pcVar8);
      pcVar8 = format("# Key type was <%d><%c>",(ulong)local_444.type);
      borg_note(pcVar8);
      pcVar8 = "user abort";
LAB_0025875d:
      borg_oops(pcVar8);
      local_458.code = 0xe000;
    }
    else {
LAB_002586b1:
      if ((local_444.type & EVT_SELECT) != EVT_NONE) {
        local_444.type = EVT_KBRD;
      }
      if ((local_444.type & EVT_MOVE) != EVT_NONE) {
        local_444.type = EVT_KBRD;
      }
      if (player->upkeep->resting == L'\0') {
        wVar7 = cmd_get_nrepeats();
        if (wVar7 < L'\x01') {
          borg_confirm_target = false;
          borg_rand_quick = Rand_quick;
          borg_rand_value = Rand_value;
          Rand_quick = true;
          Rand_value = borg_rand_local;
          do {
            _Var3 = borg_think();
          } while (!_Var3);
          borg_status();
          borg_rand_local = Rand_value;
          Rand_quick = borg_rand_quick;
          Rand_value = borg_rand_value;
          if ((borg_step != 0) && (borg_step = borg_step - 1, borg_step == 0)) {
            borg_cancel = true;
          }
          kVar4 = borg_inkey(true);
          if (kVar4 != 0) goto LAB_00258679;
          pcVar8 = "normal abort";
          goto LAB_0025875d;
        }
      }
      local_458._0_8_ = local_458._0_8_ & 0xffffffff00000000;
    }
    goto LAB_0025876a;
  }
  if (borg.trait[0x23] < borg_cfg[0x1d]) {
    pcVar8 = strstr(player->died_from,"starvation");
    if (pcVar8 != (char *)0x0) goto LAB_00258464;
  }
  else {
LAB_00258464:
    borg_write_map(false);
  }
  borg_log_death();
  borg_log_death_data();
  borg_flush();
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_oops("player died");
  local_458.code = 3;
LAB_0025876a:
  local_438.type = local_458.type;
  local_438.code = local_458.code;
  local_438.mods = local_458.mods;
  save_keypress_history(&local_438);
  kVar10._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_438.mods);
  kVar10.type = local_438.type;
  kVar10.code = local_438.code;
  return kVar10;
}

Assistant:

static struct keypress borg_inkey_hack(int flush_first)
{
    struct keypress k = internal_borg_inkey(flush_first);

    save_keypress_history(&k);

    return k;
}